

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::io::ArrayInputStream::Skip(ArrayInputStream *this,int count)

{
  bool bVar1;
  int in_ESI;
  LogMessage *in_RDI;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff88;
  LogMessage local_50;
  int local_14;
  
  local_14 = in_ESI;
  if (in_ESI < 0) {
    this_00 = &local_50;
    internal::LogMessage::LogMessage
              (in_RDI,(LogLevel_conflict)((ulong)in_stack_ffffffffffffff88 >> 0x20),(char *)this_00,
               in_stack_ffffffffffffff7c);
    internal::LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    internal::LogMessage::~LogMessage((LogMessage *)0x3e833d);
  }
  *(undefined4 *)&(in_RDI->message_).field_0x4 = 0;
  bVar1 = local_14 <= in_RDI->line_ - *(int *)&in_RDI->message_;
  if (bVar1) {
    *(int *)&in_RDI->message_ = local_14 + *(int *)&in_RDI->message_;
  }
  else {
    *(int *)&in_RDI->message_ = in_RDI->line_;
  }
  return bVar1;
}

Assistant:

bool ArrayInputStream::Skip(int count) {
  GOOGLE_CHECK_GE(count, 0);
  last_returned_size_ = 0;  // Don't let caller back up.
  if (count > size_ - position_) {
    position_ = size_;
    return false;
  } else {
    position_ += count;
    return true;
  }
}